

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# next_hit.cpp
# Opt level: O2

void __thiscall embree::Tutorial::drawGUI(Tutorial *this)

{
  ImGui::Combo("mode",&g_next_hit_mode,(char **)next_hit_mode_names,4,-1);
  if (g_next_hit_mode != 0) {
    ImGui::DragInt("max_next_hits",(int *)&g_max_next_hits,1.0,1,0x10,"%d",0);
  }
  ImGui::DragInt("max_total_hits",(int *)&g_max_total_hits,1.0,1,0x80,"%d",0);
  ImGui::Checkbox("enable_opacity",&g_enable_opacity);
  if (g_enable_opacity == true) {
    ImGui::DragFloat("curve_opacity",&g_curve_opacity,0.01,0.0,1.0,"%.3f",0);
  }
  if (g_next_hit_mode != 0) {
    ImGui::Checkbox("verify",&g_verify);
    return;
  }
  return;
}

Assistant:

void drawGUI() override
    {
      
      ImGui::Combo("mode",&g_next_hit_mode,next_hit_mode_names,4);
      if (g_next_hit_mode != 0)
        ImGui::DragInt("max_next_hits",(int*)&g_max_next_hits,1.0f,1,16);
      ImGui::DragInt("max_total_hits",(int*)&g_max_total_hits,1.0f,1,128);
      ImGui::Checkbox("enable_opacity",&g_enable_opacity);
      if (g_enable_opacity)
        ImGui::DragFloat("curve_opacity",&g_curve_opacity,0.01f,0.0f,1.0f);
      if (g_next_hit_mode != 0)
        ImGui::Checkbox("verify",&g_verify);
    }